

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

char * CTcParser::read_len_prefix_str
                 (CVmFile *fp,char *tmp_buf,size_t tmp_buf_len,size_t *ret_len,int err_if_too_long)

{
  ulong buflen;
  undefined8 in_RAX;
  char *pcVar1;
  ulong len;
  char b [2];
  undefined8 local_38;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),err_if_too_long);
  CVmFile::read_bytes(fp,(char *)((long)&local_38 + 6),2);
  buflen = local_38 >> 0x30;
  len = buflen + (ret_len == (size_t *)0x0);
  if (tmp_buf_len < len) {
    pcVar1 = (char *)0x0;
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,(int)local_38);
  }
  else {
    CVmFile::read_bytes(fp,tmp_buf,buflen);
    if (ret_len == (size_t *)0x0) {
      tmp_buf[buflen] = '\0';
    }
    else {
      *ret_len = buflen;
    }
    pcVar1 = CTcTokenizer::store_source(G_tok,tmp_buf,len);
  }
  return pcVar1;
}

Assistant:

const char *CTcParser::read_len_prefix_str
   (CVmFile *fp, char *tmp_buf, size_t tmp_buf_len, size_t *ret_len,
    int err_if_too_long)
{
    size_t read_len;
    size_t alloc_len;
    
    /* read the length to read from the file */
    read_len = (size_t)fp->read_uint2();

    /* if we need null termination, add a byte to the allocation length */
    alloc_len = read_len + (ret_len == 0 ? 1 : 0);

    /* if it won't fit in the temporary buffer, it's an error */
    if (alloc_len > tmp_buf_len)
    {
        /* log the error and return failure */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, err_if_too_long);
        return 0;
    }

    /* read the bytes into the temporary buffer */
    fp->read_bytes(tmp_buf, read_len);

    /* add null termination if required, or set the return length if not */
    if (ret_len == 0)
        tmp_buf[read_len] = '\0';
    else
        *ret_len = read_len;

    /* store the result in the tokenizer's text list and return the result */
    return G_tok->store_source(tmp_buf, alloc_len);
}